

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bqm.hpp
# Opt level: O2

void BQMTester<cimod::Sparse>::test_DenseBQMFunctionTest_add_variable(void)

{
  mapped_type *pmVar1;
  char *pcVar2;
  AssertHelper local_1c8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar;
  Linear<uint32_t,_double> bqm_linear;
  unsigned_long local_130;
  BQM<uint32_t,_double,_cimod::Sparse> bqm;
  double offset;
  Quadratic<uint32_t,_double> quadratic;
  Linear<uint32_t,_double> linear;
  
  bqm._quadmat.m_innerSize = 2;
  bqm._quadmat.m_outerIndex = (StorageIndex *)&DAT_3ff0000000000000;
  bqm._quadmat.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)0x0;
  bqm._quadmat._1_7_ = 0;
  bqm._quadmat.m_outerSize = 0;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_int_const,double>const*>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&linear,&bqm,&bqm._quadmat.m_innerNonZeros,0,&gtest_ar,&quadratic,&bqm_linear);
  bqm._quadmat.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)0x0;
  bqm._quadmat._1_7_ = 0x2000000;
  bqm._quadmat.m_outerSize = 0x3fe0000000000000;
  std::
  _Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::pair<unsigned_int,unsigned_int>const,double>const*>
            ((_Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&quadratic,&bqm,&bqm._quadmat.m_innerSize,0,&gtest_ar,&bqm_linear,&gtest_ar_5);
  offset = (double)&DAT_bfe0000000000000;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::BinaryQuadraticModel
            (&bqm,&linear,&quadratic,&offset,SPIN);
  bqm_linear._M_h._M_buckets =
       (__buckets_ptr)
       ((long)bqm._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)bqm._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start >> 2);
  gtest_ar_5._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"bqm.get_num_variables()","2",(unsigned_long *)&bqm_linear,
             (int *)&gtest_ar_5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&bqm_linear);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x117,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&bqm_linear);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    if (bqm_linear._M_h._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*bqm_linear._M_h._M_buckets)[1]._M_nxt)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bqm_linear._M_h._M_buckets = (__buckets_ptr)CONCAT44(bqm_linear._M_h._M_buckets._4_4_,2);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0x40000000000000;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::add_variable
            (&bqm,(uint *)&bqm_linear,(double *)&gtest_ar);
  bqm_linear._M_h._M_buckets = (__buckets_ptr)CONCAT44(bqm_linear._M_h._M_buckets._4_4_,1);
  gtest_ar._0_8_ = &DAT_3fd51eb851eb851f;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::add_variable
            (&bqm,(uint *)&bqm_linear,(double *)&gtest_ar);
  bqm_linear._M_h._M_buckets =
       (__buckets_ptr)((ulong)bqm_linear._M_h._M_buckets & 0xffffffff00000000);
  gtest_ar._0_8_ = &DAT_3fd51eb851eb851f;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::add_variable
            (&bqm,(uint *)&bqm_linear,(double *)&gtest_ar);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::_generate_linear
            (&bqm_linear,&bqm);
  gtest_ar_5._0_8_ =
       (long)bqm._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)bqm._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start >> 2;
  local_1c8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"bqm.get_num_variables()","3",(unsigned_long *)&gtest_ar_5,
             (int *)&local_1c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x120,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_1c8.data_ = local_1c8.data_ & 0xffffffff00000000;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&bqm_linear,(key_type *)&local_1c8);
  gtest_ar_5._0_8_ = &DAT_3fd51eb851eb851f;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"bqm_linear[0]","0.33",pmVar1,(double *)&gtest_ar_5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_1c8.data_._0_4_ = 1;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&bqm_linear,(key_type *)&local_1c8);
  gtest_ar_5._0_8_ = &DAT_3fd51eb851eb851f;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"bqm_linear[1]","0.33",pmVar1,(double *)&gtest_ar_5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x123,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_1c8.data_._0_4_ = 2;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&bqm_linear,(key_type *)&local_1c8);
  gtest_ar_5._0_8_ = &DAT_4008000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"bqm_linear[2]","3.0",pmVar1,(double *)&gtest_ar_5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x124,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix
            ((SparseMatrix<double,_1,_int> *)&gtest_ar,&bqm._quadmat);
  local_1c8.data_ =
       (AssertHelperData *)
       gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  local_130 = ((long)bqm._idx_to_label.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)bqm._idx_to_label.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) + 1;
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)&gtest_ar_5,"bqm.interaction_matrix().rows()","bqm.get_num_variables() + 1"
             ,(long *)&local_1c8,&local_130);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix((SparseMatrix<double,_1,_int> *)&gtest_ar);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x127,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix
            ((SparseMatrix<double,_1,_int> *)&gtest_ar,&bqm._quadmat);
  local_130 = ((long)bqm._idx_to_label.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)bqm._idx_to_label.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) + 1;
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)&gtest_ar_5,"bqm.interaction_matrix().cols()","bqm.get_num_variables() + 1"
             ,(long *)&local_1c8,&local_130);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix((SparseMatrix<double,_1,_int> *)&gtest_ar);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&bqm_linear._M_h);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::~BinaryQuadraticModel(&bqm);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&quadratic._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&linear._M_h);
  return;
}

Assistant:

static void test_DenseBQMFunctionTest_add_variable()
    {
        Linear<uint32_t, double> linear{ {0, 0.0}, {2, 1.0} };
        Quadratic<uint32_t, double> quadratic{ {std::make_pair(0, 2), 0.5} };
        double offset = -0.5;
        Vartype vartype = Vartype::SPIN;

        BQM<uint32_t, double, DataType> bqm(linear, quadratic, offset, vartype);

        // check length
        EXPECT_EQ(bqm.get_num_variables(), 2);

        bqm.add_variable(2, 2.0);
        bqm.add_variable(1, 0.33);
        bqm.add_variable(0, 0.33);

        Linear<uint32_t, double> bqm_linear = bqm.get_linear();

        // check length
        EXPECT_EQ(bqm.get_num_variables(), 3);
        // check linear
        EXPECT_EQ(bqm_linear[0], 0.33);
        EXPECT_EQ(bqm_linear[1], 0.33);
        EXPECT_EQ(bqm_linear[2], 3.0);


        EXPECT_EQ(bqm.interaction_matrix().rows(), bqm.get_num_variables() + 1);
        EXPECT_EQ(bqm.interaction_matrix().cols(), bqm.get_num_variables() + 1);
    }